

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BorderAmounts_EdgeSizes::MergeFrom
          (BorderAmounts_EdgeSizes *this,BorderAmounts_EdgeSizes *from)

{
  LogMessage *other;
  uint64_t uVar1;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  BorderAmounts_EdgeSizes *local_18;
  BorderAmounts_EdgeSizes *from_local;
  BorderAmounts_EdgeSizes *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x52a9);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  uVar1 = _internal_startedgesize(local_18);
  if (uVar1 != 0) {
    uVar1 = _internal_startedgesize(local_18);
    _internal_set_startedgesize(this,uVar1);
  }
  uVar1 = _internal_endedgesize(local_18);
  if (uVar1 != 0) {
    uVar1 = _internal_endedgesize(local_18);
    _internal_set_endedgesize(this,uVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BorderAmounts_EdgeSizes::MergeFrom(const BorderAmounts_EdgeSizes& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BorderAmounts.EdgeSizes)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_startedgesize() != 0) {
    _internal_set_startedgesize(from._internal_startedgesize());
  }
  if (from._internal_endedgesize() != 0) {
    _internal_set_endedgesize(from._internal_endedgesize());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}